

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O2

ExpandMacroResult
cmCMakePresetsGraphInternal::ExpandMacro
          (string *out,string *macroNamespace,string *macroName,MacroExpanderVector *macroExpanders,
          int version)

{
  pointer puVar1;
  MacroExpander *pMVar2;
  bool bVar3;
  ExpandMacroResult EVar4;
  pointer puVar5;
  
  puVar5 = (macroExpanders->
           super__Vector_base<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (macroExpanders->
           super__Vector_base<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (puVar5 == puVar1) {
      bVar3 = std::operator==(macroNamespace,"vendor");
      return Error - bVar3;
    }
    pMVar2 = (puVar5->_M_t).
             super___uniq_ptr_impl<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmCMakePresetsGraphInternal::MacroExpander_*,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>
             .super__Head_base<0UL,_cmCMakePresetsGraphInternal::MacroExpander_*,_false>.
             _M_head_impl;
    EVar4 = (**pMVar2->_vptr_MacroExpander)(pMVar2,macroNamespace,macroName,out,version);
    puVar5 = puVar5 + 1;
  } while (EVar4 == Ignore);
  return EVar4;
}

Assistant:

ExpandMacroResult cmCMakePresetsGraphInternal::ExpandMacro(
  std::string& out, const std::string& macroNamespace,
  const std::string& macroName, MacroExpanderVector const& macroExpanders,
  int version)
{
  for (auto const& macroExpander : macroExpanders) {
    auto result = (*macroExpander)(macroNamespace, macroName, out, version);
    if (result != ExpandMacroResult::Ignore) {
      return result;
    }
  }

  if (macroNamespace == "vendor") {
    return ExpandMacroResult::Ignore;
  }

  return ExpandMacroResult::Error;
}